

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffeqtyll(fitsfile *fptr,int colnum,int *typecode,LONGLONG *repeat,LONGLONG *width,int *status)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long local_90;
  long tmpwidth;
  long lngzero;
  long lngscale;
  double max_val;
  double min_val;
  double tzero;
  double tscale;
  int effcode;
  int tcode;
  int decims;
  int hdutype;
  tcolumn *colptr;
  int *status_local;
  LONGLONG *width_local;
  LONGLONG *repeat_local;
  int *typecode_local;
  fitsfile *pfStack_18;
  int colnum_local;
  fitsfile *fptr_local;
  
  tmpwidth = 0;
  if (0 < *status) {
    return *status;
  }
  colptr = (tcolumn *)status;
  status_local = (int *)width;
  width_local = repeat;
  repeat_local = (LONGLONG *)typecode;
  typecode_local._4_4_ = colnum;
  pfStack_18 = fptr;
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar3 = ffrdef(fptr,status), 0 < iVar3)) {
      return *(int *)colptr->ttype;
    }
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if ((typecode_local._4_4_ < 1) || (pfStack_18->Fptr->tfield < typecode_local._4_4_)) {
    colptr->ttype[0] = '.';
    colptr->ttype[1] = '\x01';
    colptr->ttype[2] = '\0';
    colptr->ttype[3] = '\0';
    return 0x12e;
  }
  _decims = pfStack_18->Fptr->tableptr + (typecode_local._4_4_ + -1);
  iVar3 = ffghdt(pfStack_18,&tcode,(int *)colptr);
  if (0 < iVar3) {
    return *(int *)colptr->ttype;
  }
  if (tcode == 1) {
    ffasfm(_decims->tform,(int *)repeat_local,&local_90,&effcode,(int *)colptr);
    if (status_local != (int *)0x0) {
      *(long *)status_local = local_90;
    }
    if (width_local != (LONGLONG *)0x0) {
      *width_local = 1;
    }
  }
  else {
    if (repeat_local != (LONGLONG *)0x0) {
      *(int *)repeat_local = _decims->tdatatype;
    }
    if (status_local != (int *)0x0) {
      *(long *)status_local = _decims->twidth;
    }
    if (width_local != (LONGLONG *)0x0) {
      *width_local = _decims->trepeat;
    }
  }
  if (repeat_local == (LONGLONG *)0x0) {
    return *(int *)colptr->ttype;
  }
  dVar1 = _decims->tscale;
  dVar2 = _decims->tzero;
  if ((((dVar1 == 1.0) && (!NAN(dVar1))) && (dVar2 == 0.0)) && (!NAN(dVar2))) {
    return *(int *)colptr->ttype;
  }
  iVar3 = (int)*repeat_local;
  if (iVar3 < 1) {
    iVar3 = -iVar3;
  }
  if (iVar3 == 0xb) {
    max_val = 0.0;
    lngscale = 0x406fe00000000000;
  }
  else if (iVar3 == 0x15) {
    max_val = -32768.0;
    lngscale = 0x40dfffc000000000;
  }
  else if (iVar3 == 0x29) {
    max_val = -2147483648.0;
    lngscale = 0x41dfffffffc00000;
  }
  else {
    if (iVar3 != 0x51) {
      return *(int *)colptr->ttype;
    }
    max_val = -9.223372036854776e+18;
    lngscale = 0x43e0000000000000;
  }
  if (dVar1 < 0.0) {
    lngscale = (long)(dVar1 * max_val + dVar2);
    max_val = (double)lngscale;
  }
  else {
    lngscale = (long)(dVar1 * (double)lngscale + dVar2);
  }
  max_val = dVar1 * max_val + dVar2;
  if (dVar2 < 2147483648.0) {
    tmpwidth = (long)dVar2;
  }
  if (((dVar2 == 2147483648.0) && (!NAN(dVar2))) ||
     ((dVar2 == 9.223372036854776e+18 && (!NAN(dVar2))))) {
LAB_001ba694:
    if ((((max_val != -128.0) || (NAN(max_val))) || ((double)lngscale != 127.0)) ||
       (NAN((double)lngscale))) {
      if ((max_val < -32768.0) || (32767.0 < (double)lngscale)) {
        if ((max_val < 0.0) || (65535.0 < (double)lngscale)) {
          if ((max_val < -2147483648.0) || (2147483647.0 < (double)lngscale)) {
            if ((max_val < 0.0) || (4294967296.0 <= (double)lngscale)) {
              if ((max_val < -9.223372036854776e+18) || (9.223372036854776e+18 < (double)lngscale))
              {
                if ((max_val < 0.0) || (1.8446744073709552e+19 < (double)lngscale)) {
                  tscale._0_4_ = 0x52;
                }
                else {
                  tscale._0_4_ = 0x50;
                }
              }
              else {
                tscale._0_4_ = 0x51;
              }
            }
            else {
              tscale._0_4_ = 0x28;
            }
          }
          else {
            tscale._0_4_ = 0x29;
          }
        }
        else {
          tscale._0_4_ = 0x14;
        }
      }
      else {
        tscale._0_4_ = 0x15;
      }
    }
    else {
      tscale._0_4_ = 0xc;
    }
  }
  else {
    if (((double)tmpwidth == dVar2) && (!NAN((double)tmpwidth) && !NAN(dVar2))) {
      if (((double)(long)dVar1 == dVar1) && (!NAN((double)(long)dVar1) && !NAN(dVar1)))
      goto LAB_001ba694;
    }
    if ((iVar3 == 0xb) || (iVar3 == 0x15)) {
      tscale._0_4_ = 0x2a;
    }
    else {
      tscale._0_4_ = 0x52;
    }
  }
  if ((int)*repeat_local < 0) {
    *(int *)repeat_local = -tscale._0_4_;
  }
  else {
    *(int *)repeat_local = tscale._0_4_;
  }
  return *(int *)colptr->ttype;
}

Assistant:

int ffeqtyll( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - column number                           */
            int *typecode,   /* O - datatype code (21 = short, etc)         */
            LONGLONG *repeat,    /* O - repeat count of field                   */
            LONGLONG *width,     /* O - if ASCII, width of field or unit string */
            int  *status)    /* IO - error status                           */
/*
  Get the 'equivalent' table column type. 

  This routine is similar to the ffgtcl routine (which returns the physical
  datatype of the column, as stored in the FITS file) except that if the
  TSCALn and TZEROn keywords are defined for the column, then it returns
  the 'equivalent' datatype.  Thus, if the column is defined as '1I'  (short
  integer) this routine may return the type as 'TUSHORT' or as 'TFLOAT'
  depending on the TSCALn and TZEROn values.
  
  Returns the datatype code of the column, as well as the vector
  repeat count and (if it is an ASCII character column) the
  width of the field or a unit string within the field.  This supports the
  TFORMn = 'rAw' syntax for specifying arrays of substrings, so
  if TFORMn = '60A12' then repeat = 60 and width = 12.
*/
{
    tcolumn *colptr;
    int hdutype, decims, tcode, effcode;
    double tscale, tzero, min_val, max_val;
    long lngscale, lngzero = 0, tmpwidth;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
        return(*status = BAD_COL_NUM);

    colptr = (fptr->Fptr)->tableptr;   /* pointer to first column */
    colptr += (colnum - 1);    /* offset to correct column */

    if (ffghdt(fptr, &hdutype, status) > 0)
        return(*status);

    if (hdutype == ASCII_TBL)
    {
      ffasfm(colptr->tform, typecode, &tmpwidth, &decims, status);
      if (width)
          *width = tmpwidth;

      if (repeat)
           *repeat = 1;
    }
    else
    {
      if (typecode)
          *typecode = colptr->tdatatype;

      if (width)
          *width = colptr->twidth;

      if (repeat)
          *repeat = colptr->trepeat;
    }

    /* return if caller is not interested in the typecode value */
    if (!typecode)
        return(*status);

    /* check if the tscale and tzero keywords are defined, which might
       change the effective datatype of the column  */

    tscale = colptr->tscale;
    tzero = colptr->tzero;

    if (tscale == 1.0 && tzero == 0.0)  /* no scaling */
        return(*status);
 
    tcode = abs(*typecode);

    switch (tcode)
    {
      case TBYTE:   /* binary table 'rB' column */
        min_val = 0.;
        max_val = 255.0;
        break;

      case TSHORT:
        min_val = -32768.0;
        max_val =  32767.0;
        break;
        
      case TLONG:

        min_val = -2147483648.0;
        max_val =  2147483647.0;
        break;
        
      case TLONGLONG:
        min_val = -9.2233720368547755808E18;
        max_val =  9.2233720368547755807E18;
        break;
	
      default:  /* don't have to deal with other data types */
        return(*status);
    }

    if (tscale >= 0.) {
        min_val = tzero + tscale * min_val;
        max_val = tzero + tscale * max_val;
    } else {
        max_val = tzero + tscale * min_val;
        min_val = tzero + tscale * max_val;
    }
    if (tzero < 2147483648.)  /* don't exceed range of 32-bit integer */
       lngzero = (long) tzero;
    lngscale   = (long) tscale;

    if ((tzero != 2147483648.) && /* special value that exceeds integer range */
        (tzero != 9223372036854775808.) &&  /* indicates unsigned long long */
       (lngzero != tzero || lngscale != tscale)) { /* not integers? */
       /* floating point scaled values; just decide on required precision */
       if (tcode == TBYTE || tcode == TSHORT)
          effcode = TFLOAT;
       else
          effcode = TDOUBLE;

    /*
       In all the remaining cases, TSCALn and TZEROn are integers,
       and not equal to 1 and 0, respectively.  
    */

    } else if ((min_val == -128.) && (max_val == 127.)) {
        effcode = TSBYTE;
 
    } else if ((min_val >= -32768.0) && (max_val <= 32767.0)) {
        effcode = TSHORT;

    } else if ((min_val >= 0.0) && (max_val <= 65535.0)) {
        effcode = TUSHORT;

    } else if ((min_val >= -2147483648.0) && (max_val <= 2147483647.0)) {
        effcode = TLONG;

    } else if ((min_val >= 0.0) && (max_val < 4294967296.0)) {
        effcode = TULONG;

    } else if ((min_val >= -9.2233720368547755808E18) && (max_val <= 9.2233720368547755807E18)) {
        effcode = TLONGLONG;

    } else if ((min_val >= 0.0) && (max_val <= 1.8446744073709551616E19)) {
        effcode = TULONGLONG;

    } else {  /* exceeds the range of a 64-bit integer */
        effcode = TDOUBLE;
    }   

    /* return the effective datatype code (negative if variable length col.) */
    if (*typecode < 0)  /* variable length array column */
        *typecode = -effcode;
    else
        *typecode = effcode;

    return(*status);
}